

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  char *pcVar3;
  Context *context;
  long *plVar4;
  long *plVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  ImmutableFieldGenerator *pIVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int i;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *pDVar12;
  undefined8 extraout_RDX_05;
  long lVar13;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar14;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_11;
  ImmutableMessageGenerator *pIVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  java *this_01;
  long lVar19;
  char *pcVar20;
  ImmutableMessageGenerator *pIVar21;
  ImmutableMessageGenerator messageGenerator;
  string out_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  string builder_type;
  string local_1c0;
  undefined2 *local_1a0;
  undefined8 local_198;
  undefined2 local_190;
  undefined1 uStack_18e;
  undefined5 uStack_18d;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar12 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar12 + 0x18) == 0) {
    pcVar20 = " static ";
    if (*(char *)(*(long *)(*(long *)(pDVar12 + 0x10) + 0xa0) + 0xa0) != '\0') {
      pcVar20 = " ";
    }
  }
  else {
    pcVar20 = " static ";
  }
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"static","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_218,(key_type *)&messageGenerator);
  pcVar3 = (char *)pmVar10->_M_string_length;
  strlen(pcVar20);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar3,(ulong)pcVar20);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"classname","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_218,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  pDVar12 = extraout_RDX;
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
    pDVar12 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,pDVar12)
  ;
  pp_Var2 = &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  vars._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"extra_interfaces","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_218,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&messageGenerator);
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)vars._M_t._M_impl._0_8_,
                    (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  messageGenerator.context_._0_2_ = 0x3356;
  messageGenerator.super_MessageGenerator.descriptor_ = (Descriptor *)0x2;
  messageGenerator.context_._2_1_ = 0;
  vars._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"ver","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_218,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&messageGenerator);
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)vars._M_t._M_impl._0_8_,
                    (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  pIVar15 = this;
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  pcVar20 = "";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x6a) != '\0') {
    pcVar20 = "@java.lang.Deprecated ";
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"deprecation","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_218,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar10,0,(char *)pmVar10->_M_string_length,(ulong)pcVar20);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar12 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar12,true,(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) < 1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_218,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname","classname",(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_218,
                       "    com.google.protobuf.GeneratedMessage$ver$ implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    paVar1 = &local_238.field_2;
    local_238.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_238._M_string_length = 2;
    local_238.field_2._M_local_buf[2] = '\0';
    messageGenerator.super_MessageGenerator.descriptor_ =
         (Descriptor *)CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,2);
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    out_1._M_dataplus._M_p = (pointer)0x0;
    out_1._M_string_length._0_4_ = 0xffffffff;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)paVar1;
    local_238._M_dataplus._M_p = (pointer)paVar1;
    strings::Substitute_abi_cxx11_
              (&local_1c0,(strings *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,(SubstituteArg *)&out_1,&local_60,
               &local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,
               (SubstituteArg *)pIVar15);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    pIVar21 = pIVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT53(local_238.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_238.field_2._M_local_buf[2],
                                        local_238.field_2._M_allocated_capacity._0_2_)) + 1);
      pIVar21 = pIVar15;
    }
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_218,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname","classname",(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_218,
                       "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_238,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_238._M_dataplus._M_p;
    messageGenerator.super_MessageGenerator.descriptor_ =
         (Descriptor *)
         CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                  (undefined4)local_238._M_string_length);
    local_190 = 0x3356;
    local_198 = 2;
    uStack_18e = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
    out_1._M_dataplus._M_p = (pointer)0x0;
    out_1._M_string_length._0_4_ = 0xffffffff;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    vars._M_t._M_impl._0_8_ = &local_190;
    local_1a0 = &local_190;
    strings::Substitute_abi_cxx11_
              (&local_1c0,
               (strings *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,(SubstituteArg *)&out_1,&local_60,
               &local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,
               (SubstituteArg *)pIVar15);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,CONCAT53(uStack_18d,CONCAT12(uStack_18e,local_190)) + 1);
    }
    pIVar21 = pIVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT53(local_238.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_238.field_2._M_local_buf[2],
                                        local_238.field_2._M_allocated_capacity._0_2_)) + 1);
    }
  }
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
                     ,"classname",*(string **)(pIVar15->super_MessageGenerator).descriptor_,
                     "buildertype",&builder_type);
  io::Printer::Print(printer,"private $classname$() {\n","classname",
                     *(string **)(pIVar15->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  GenerateInitializers(pIVar15,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n"
                    );
  pcVar20 = "  return this.unknownFields;\n";
  if (*(int *)(*(long *)((pIVar15->super_MessageGenerator).descriptor_ + 0x10) + 0x8c) == 3) {
    pcVar20 = "  return com.google.protobuf.UnknownFieldSet.getDefaultInstance();\n";
  }
  io::Printer::Print(printer,pcVar20);
  io::Printer::Print(printer,"}\n");
  bVar7 = Context::HasGeneratedMethods
                    (pIVar15->context_,(pIVar15->super_MessageGenerator).descriptor_);
  if (bVar7) {
    GenerateParsingConstructor(pIVar15,printer);
  }
  GenerateDescriptorMethods(pIVar15,printer);
  pDVar12 = (pIVar15->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar12 + 0x58)) {
    lVar16 = 0;
    lVar19 = 0;
    do {
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)&messageGenerator,
                 (EnumDescriptor *)(*(long *)(pDVar12 + 0x60) + lVar16),true,pIVar21->context_);
      EnumGenerator::Generate((EnumGenerator *)&messageGenerator,printer);
      EnumGenerator::~EnumGenerator((EnumGenerator *)&messageGenerator);
      lVar19 = lVar19 + 1;
      pDVar12 = (pIVar21->super_MessageGenerator).descriptor_;
      lVar16 = lVar16 + 0x38;
    } while (lVar19 < *(int *)(pDVar12 + 0x58));
  }
  if (0 < *(int *)(pDVar12 + 0x48)) {
    lVar16 = 0;
    lVar19 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar12 + 0x50) + 0x20 + lVar16) + 0x6b) == '\0') {
        ImmutableMessageGenerator
                  (&messageGenerator,(Descriptor *)(*(long *)(pDVar12 + 0x50) + lVar16),
                   pIVar21->context_);
        GenerateInterface(&messageGenerator,printer);
        Generate(&messageGenerator,printer);
        messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
             (_func_int **)&PTR__ImmutableMessageGenerator_00421648;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        ~FieldGeneratorMap(&messageGenerator.field_generators_);
        pDVar12 = (pIVar21->super_MessageGenerator).descriptor_;
      }
      lVar19 = lVar19 + 1;
      lVar16 = lVar16 + 0xa8;
    } while (lVar19 < *(int *)(pDVar12 + 0x48));
  }
  pIVar15 = pIVar21;
  if (*(int *)(*(long *)(pDVar12 + 0x10) + 0x8c) == 3) {
    bVar7 = HasRepeatedFields(pDVar12);
    pDVar12 = (pIVar21->super_MessageGenerator).descriptor_;
    pIVar15 = pIVar21;
    if (!bVar7) goto LAB_0026e903;
  }
  pIVar21 = pIVar15;
  if (0 < *(int *)(pDVar12 + 0x2c)) {
    this_00 = &pIVar15->field_generators_;
    lVar19 = 0;
    lVar16 = 0;
    iVar9 = 0;
    do {
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (this_00,(FieldDescriptor *)(*(long *)(pDVar12 + 0x30) + lVar19));
      iVar8 = (*pIVar11->_vptr_ImmutableFieldGenerator[2])(pIVar11);
      iVar9 = iVar9 + iVar8;
      lVar16 = lVar16 + 1;
      pDVar12 = (pIVar15->super_MessageGenerator).descriptor_;
      lVar19 = lVar19 + 0xa8;
    } while (lVar16 < *(int *)(pDVar12 + 0x2c));
    pIVar21 = pIVar15;
    if (0 < iVar9) {
      this_01 = (java *)0x0;
      uVar14 = extraout_RDX_01;
      do {
        GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_01,(int)uVar14);
        io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                           (string *)&messageGenerator);
        uVar14 = extraout_RDX_02;
        if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
            &messageGenerator.context_) {
          operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                          CONCAT53(messageGenerator.context_._3_5_,
                                   CONCAT12(messageGenerator.context_._2_1_,
                                            messageGenerator.context_._0_2_)) + 1);
          uVar14 = extraout_RDX_03;
        }
        uVar18 = (int)this_01 + 1;
        this_01 = (java *)(ulong)uVar18;
      } while (iVar9 + 0x1fU >> 5 != uVar18);
      pDVar12 = (pIVar15->super_MessageGenerator).descriptor_;
    }
  }
LAB_0026e903:
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &out_1.field_2;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pDVar12 + 0x38)) {
    lVar16 = 0;
    do {
      lVar19 = lVar16 * 0x30;
      Context::GetOneofGeneratorInfo
                (pIVar21->context_,(OneofDescriptor *)(*(long *)(pDVar12 + 0x40) + lVar19));
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"oneof_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        CONCAT53(messageGenerator.context_._3_5_,
                                 CONCAT12(messageGenerator.context_._2_1_,
                                          messageGenerator.context_._0_2_)) + 1);
      }
      Context::GetOneofGeneratorInfo
                (pIVar21->context_,
                 (OneofDescriptor *)
                 (*(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x40) + lVar19));
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,"oneof_capitalized_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      iVar9 = extraout_EDX;
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        CONCAT53(messageGenerator.context_._3_5_,
                                 CONCAT12(messageGenerator.context_._2_1_,
                                          messageGenerator.context_._0_2_)) + 1);
        iVar9 = extraout_EDX_00;
      }
      lVar13 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x40);
      SimpleItoa_abi_cxx11_
                ((string *)&messageGenerator,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((lVar13 + lVar19) -
                                            *(long *)(*(long *)(lVar13 + 0x10 + lVar19) + 0x40)) >>
                                    4) * -0x55555555),iVar9);
      out_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out_1,"oneof_index","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out_1);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)&messageGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_1._M_dataplus._M_p != paVar1) {
        operator_delete(out_1._M_dataplus._M_p,out_1.field_2._M_allocated_capacity + 1);
      }
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        CONCAT53(messageGenerator.context_._3_5_,
                                 CONCAT12(messageGenerator.context_._2_1_,
                                          messageGenerator.context_._0_2_)) + 1);
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,
                         "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite {\n"
                        );
      io::Printer::Indent(printer);
      lVar13 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x40);
      if (0 < *(int *)(lVar13 + 0x1c + lVar19)) {
        lVar17 = 0;
        do {
          plVar4 = *(long **)(*(long *)(lVar13 + 0x20 + lVar19) + lVar17 * 8);
          plVar5 = (long *)*plVar4;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
               (_func_int **)&messageGenerator.context_;
          lVar13 = *plVar5;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&messageGenerator,lVar13,plVar5[1] + lVar13);
          pDVar12 = extraout_RDX_04;
          if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
            pDVar12 = (Descriptor *)0x0;
            do {
              if ((byte)((char)*(Descriptor *)
                                ((long)messageGenerator.super_MessageGenerator.
                                       _vptr_MessageGenerator + (long)pDVar12) + 0x9fU) < 0x1a) {
                *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                         (long)pDVar12) =
                     (char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar12) + -0x20;
              }
              pDVar12 = pDVar12 + 1;
            } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar12);
          }
          SimpleItoa_abi_cxx11_(&out_1,(protobuf *)(ulong)*(uint *)(plVar4 + 7),(int)pDVar12);
          io::Printer::Print(printer,"$field_name$($field_number$),\n","field_name",
                             (string *)&messageGenerator,"field_number",&out_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_1._M_dataplus._M_p != paVar1) {
            operator_delete(out_1._M_dataplus._M_p,out_1.field_2._M_allocated_capacity + 1);
          }
          if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
              &messageGenerator.context_) {
            operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                            CONCAT53(messageGenerator.context_._3_5_,
                                     CONCAT12(messageGenerator.context_._2_1_,
                                              messageGenerator.context_._0_2_)) + 1);
          }
          lVar17 = lVar17 + 1;
          lVar13 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x40);
        } while (lVar17 < *(int *)(lVar13 + 0x1c + lVar19));
      }
      out_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out_1,"oneof_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out_1);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar6 = (pmVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar6,pcVar6 + pmVar10->_M_string_length);
      if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
        pDVar12 = (Descriptor *)0x0;
        do {
          if ((byte)((char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar12) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                     (long)pDVar12) =
                 (char)*(Descriptor *)
                        ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                        (long)pDVar12) + -0x20;
          }
          pDVar12 = pDVar12 + 1;
        } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar12);
      }
      io::Printer::Print(printer,"$cap_oneof_name$_NOT_SET(0);\n","cap_oneof_name",
                         (string *)&messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        CONCAT53(messageGenerator.context_._3_5_,
                                 CONCAT12(messageGenerator.context_._2_1_,
                                          messageGenerator.context_._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_1._M_dataplus._M_p != paVar1) {
        operator_delete(out_1._M_dataplus._M_p,out_1.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(printer,&vars,
                         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                        );
      io::Printer::Print(printer,&vars,
                         "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                        );
      lVar13 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x40);
      if (0 < *(int *)(lVar13 + 0x1c + lVar19)) {
        lVar17 = 0;
        uVar14 = extraout_RDX_05;
        do {
          plVar4 = *(long **)(*(long *)(lVar13 + 0x20 + lVar19) + lVar17 * 8);
          SimpleItoa_abi_cxx11_
                    ((string *)&messageGenerator,(protobuf *)(ulong)*(uint *)(plVar4 + 7),
                     (int)uVar14);
          plVar4 = (long *)*plVar4;
          lVar13 = *plVar4;
          out_1._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>((string *)&out_1,lVar13,plVar4[1] + lVar13);
          if (CONCAT44(out_1._M_string_length._4_4_,(undefined4)out_1._M_string_length) != 0) {
            lVar13 = 0;
            do {
              if ((byte)(out_1._M_dataplus._M_p[lVar13] + 0x9fU) < 0x1a) {
                out_1._M_dataplus._M_p[lVar13] = out_1._M_dataplus._M_p[lVar13] + -0x20;
              }
              lVar13 = lVar13 + 1;
            } while (CONCAT44(out_1._M_string_length._4_4_,(undefined4)out_1._M_string_length) !=
                     lVar13);
          }
          io::Printer::Print(printer,"    case $field_number$: return $field_name$;\n",
                             "field_number",(string *)&messageGenerator,"field_name",&out_1);
          uVar14 = extraout_RDX_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_1._M_dataplus._M_p != paVar1) {
            operator_delete(out_1._M_dataplus._M_p,out_1.field_2._M_allocated_capacity + 1);
            uVar14 = extraout_RDX_07;
          }
          if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
              &messageGenerator.context_) {
            operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                            CONCAT53(messageGenerator.context_._3_5_,
                                     CONCAT12(messageGenerator.context_._2_1_,
                                              messageGenerator.context_._0_2_)) + 1);
            uVar14 = extraout_RDX_08;
          }
          lVar17 = lVar17 + 1;
          lVar13 = *(long *)((pIVar21->super_MessageGenerator).descriptor_ + 0x40);
        } while (lVar17 < *(int *)(lVar13 + 0x1c + lVar19));
      }
      out_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out_1,"oneof_name","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out_1);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar6 = (pmVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar6,pcVar6 + pmVar10->_M_string_length);
      if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
        pDVar12 = (Descriptor *)0x0;
        do {
          if ((byte)((char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar12) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                     (long)pDVar12) =
                 (char)*(Descriptor *)
                        ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                        (long)pDVar12) + -0x20;
          }
          pDVar12 = pDVar12 + 1;
        } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar12);
      }
      io::Printer::Print(printer,
                         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                         ,"cap_oneof_name",(string *)&messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        CONCAT53(messageGenerator.context_._3_5_,
                                 CONCAT12(messageGenerator.context_._2_1_,
                                          messageGenerator.context_._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_1._M_dataplus._M_p != paVar1) {
        operator_delete(out_1._M_dataplus._M_p,out_1.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"};\n\n");
      io::Printer::Print(printer,&vars,
                         "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
                        );
      lVar16 = lVar16 + 1;
      pDVar12 = (pIVar21->super_MessageGenerator).descriptor_;
    } while (lVar16 < *(int *)(pDVar12 + 0x38));
  }
  pIVar15 = pIVar21;
  iVar9 = std::__cxx11::string::compare(*(char **)(pDVar12 + 8));
  field = extraout_RDX_09;
  if (iVar9 == 0) {
    io::Printer::Print(printer,
                       "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  if (!is(clazz)) {\n    throw new com.google.protobuf.InvalidProtocolBufferException(\n        \"Type of the Any message does not match the given class.\");\n  }\n  if (cachedUnpackValue != null) {\n    return (T) cachedUnpackValue;\n ..." /* TRUNCATED STRING LITERAL */
                      );
    field = extraout_RDX_10;
  }
  pDVar12 = (pIVar21->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar12 + 0x2c)) {
    lVar16 = 0;
    lVar19 = 0;
    do {
      FieldConstantName_abi_cxx11_
                ((string *)&messageGenerator,(java *)(*(long *)(pDVar12 + 0x30) + lVar16),field);
      SimpleItoa_abi_cxx11_
                (&out_1,(protobuf *)
                        (ulong)*(uint *)(*(long *)((pIVar15->super_MessageGenerator).descriptor_ +
                                                  0x30) + 0x38 + lVar16),i);
      io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                         "constant_name",(string *)&messageGenerator,"number",&out_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_1._M_dataplus._M_p != paVar1) {
        operator_delete(out_1._M_dataplus._M_p,out_1.field_2._M_allocated_capacity + 1);
      }
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        CONCAT53(messageGenerator.context_._3_5_,
                                 CONCAT12(messageGenerator.context_._2_1_,
                                          messageGenerator.context_._0_2_)) + 1);
      }
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (&pIVar21->field_generators_,
                           (FieldDescriptor *)
                           (*(long *)((pIVar15->super_MessageGenerator).descriptor_ + 0x30) + lVar16
                           ));
      (*pIVar11->_vptr_ImmutableFieldGenerator[5])(pIVar11,printer);
      io::Printer::Print(printer,"\n");
      lVar19 = lVar19 + 1;
      pDVar12 = (pIVar15->super_MessageGenerator).descriptor_;
      lVar16 = lVar16 + 0xa8;
      field = extraout_RDX_11;
    } while (lVar19 < *(int *)(pDVar12 + 0x2c));
  }
  pIVar21 = pIVar15;
  bVar7 = Context::HasGeneratedMethods(pIVar15->context_,pDVar12);
  if (bVar7) {
    GenerateIsInitialized(pIVar15,printer);
    GenerateMessageSerializationMethods(pIVar15,printer);
    GenerateEqualsAndHashCode(pIVar15,printer);
  }
  GenerateParseFromMethods(pIVar15,printer);
  GenerateBuilder(pIVar15,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)((pIVar15->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,pIVar15->name_resolver_,
             (pIVar15->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,"private static final $classname$ DEFAULT_INSTANCE;\n","classname",
                     (string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,pIVar15->name_resolver_,
             (pIVar15->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n","classname",
                     (string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,pIVar15->name_resolver_,
             (pIVar15->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  GenerateParser(pIVar15,printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,pIVar15->name_resolver_,
             (pIVar15->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    CONCAT53(messageGenerator.context_._3_5_,
                             CONCAT12(messageGenerator.context_._2_1_,
                                      messageGenerator.context_._0_2_)) + 1);
  }
  pDVar12 = (pIVar15->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar12 + 0x78)) {
    lVar16 = 0;
    lVar19 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)&messageGenerator,
                 (FieldDescriptor *)(*(long *)(pDVar12 + 0x80) + lVar16),pIVar15->context_);
      ImmutableExtensionGenerator::Generate
                ((ImmutableExtensionGenerator *)&messageGenerator,printer);
      pIVar15 = pIVar21;
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)&messageGenerator);
      lVar19 = lVar19 + 1;
      pDVar12 = (pIVar15->super_MessageGenerator).descriptor_;
      lVar16 = lVar16 + 0xa8;
      pIVar21 = pIVar15;
    } while (lVar19 < *(int *)(pDVar12 + 0x78));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)builder_type._M_dataplus._M_p != &builder_type.field_2) {
    operator_delete(builder_type._M_dataplus._M_p,
                    CONCAT71(builder_type.field_2._M_allocated_capacity._1_7_,
                             builder_type.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_218);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<string, string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] = descriptor_->options().deprecated()
      ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
      "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$0.Builder<?>",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
    "// Use $classname$.newBuilder() to construct.\n"
    "private $classname$($buildertype$ builder) {\n"
    "  super(builder);\n"
    "}\n",
    "classname", descriptor_->name(),
    "buildertype", builder_type);
  printer->Print(
    "private $classname$() {\n",
    "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "@java.lang.Override\n"
    "public final com.google.protobuf.UnknownFieldSet\n"
    "getUnknownFields() {\n");
  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "  return this.unknownFields;\n");
  } else {
    printer->Print(
      "  return com.google.protobuf.UnknownFieldSet.getDefaultInstance();\n");
  }
  printer->Print(
    "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(
        descriptor_->nested_type(i), context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->capitalized_name;
    vars["oneof_index"] = SimpleItoa(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars,
      "public enum $oneof_capitalized_name$Case\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "$field_name$($field_number$),\n",
        "field_name",
        ToUpper(field->name()),
        "field_number",
        SimpleItoa(field->number()));
    }
    printer->Print(
      "$cap_oneof_name$_NOT_SET(0);\n",
      "cap_oneof_name",
      ToUpper(vars["oneof_name"]));
    printer->Print(vars,
      "private final int value;\n"
      "private $oneof_capitalized_name$Case(int value) {\n"
      "  this.value = value;\n"
      "}\n");
    printer->Print(vars,
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
      "  switch (value) {\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "    case $field_number$: return $field_name$;\n",
        "field_number",
        SimpleItoa(field->number()),
        "field_name",
        ToUpper(field->name()));
    }
    printer->Print(
      "    case 0: return $cap_oneof_name$_NOT_SET;\n"
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "public int getNumber() {\n"
      "  return this.value;\n"
      "}\n",
      "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());


  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "private static final $classname$ DEFAULT_INSTANCE;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
    "static {\n"
    "  DEFAULT_INSTANCE = new $classname$();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateParser(printer);

  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return DEFAULT_INSTANCE;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}